

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_1::PatchVertexCount::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  int outPatchSize;
  pointer vertexData_00;
  int i;
  int iVar1;
  VkDeviceSize vertexDataSizeBytes;
  float fVar2;
  vector<float,_std::allocator<float>_> vertexData;
  TextureLevel referenceImage;
  ConstPixelBufferAccess local_58;
  
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&vertexData,(long)caseDef->inPatchSize);
  for (iVar1 = 0; iVar1 < caseDef->inPatchSize; iVar1 = iVar1 + 1) {
    fVar2 = (float)iVar1 / (float)(caseDef->inPatchSize + -1);
    referenceImage.m_format.order = (ChannelOrder)(fVar2 * fVar2);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&vertexData,(float *)&referenceImage);
  }
  vertexDataSizeBytes =
       (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  tcu::TextureLevel::TextureLevel(&referenceImage);
  tcu::ImageIO::loadPNG
            (&referenceImage,context->m_testCtx->m_curArchive,
             (caseDef->referenceImagePath)._M_dataplus._M_p);
  vertexData_00 =
       vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  iVar1 = caseDef->inPatchSize;
  outPatchSize = caseDef->outPatchSize;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_58,&referenceImage);
  runTest(__return_storage_ptr__,context,1,iVar1,outPatchSize,VK_FORMAT_R32_SFLOAT,vertexData_00,
          vertexDataSizeBytes,&local_58);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&vertexData.super__Vector_base<float,_std::allocator<float>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	// Input vertex attribute data
	std::vector<float> vertexData;
	vertexData.reserve(caseDef.inPatchSize);
	for (int i = 0; i < caseDef.inPatchSize; ++i)
	{
		const float f = static_cast<float>(i) / static_cast<float>(caseDef.inPatchSize - 1);
		vertexData.push_back(f*f);
	}
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	// Load reference image
	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());

	const int numPrimitives = 1;

	return runTest(context, numPrimitives, caseDef.inPatchSize, caseDef.outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}